

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 GenStateCompileJSONEntry
                (jx9_gen_state *pGen,SyToken *pIn,SyToken *pEnd,sxi32 iFlags,
                _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xValidator)

{
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  sxi32 rc;
  SyToken *pTmpEnd;
  SyToken *pTmpIn;
  _func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *xValidator_local;
  sxi32 iFlags_local;
  SyToken *pEnd_local;
  SyToken *pIn_local;
  jx9_gen_state *pGen_local;
  
  pSVar1 = pGen->pIn;
  pSVar2 = pGen->pEnd;
  pGen->pIn = pIn;
  pGen->pEnd = pEnd;
  sVar3 = jx9CompileExpr(pGen,iFlags,xValidator);
  pGen->pIn = pSVar1;
  pGen->pEnd = pSVar2;
  return sVar3;
}

Assistant:

static sxi32 GenStateCompileJSONEntry(
	jx9_gen_state *pGen, /* Code generator state */
	SyToken *pIn,        /* Token stream */
	SyToken *pEnd,       /* End of the token stream */
	sxi32 iFlags,        /* Compilation flags */
	sxi32 (*xValidator)(jx9_gen_state *,jx9_expr_node *) /* Expression tree validator callback */
	)
{
	SyToken *pTmpIn, *pTmpEnd;
	sxi32 rc;
	/* Swap token stream */
	SWAP_DELIMITER(pGen, pIn, pEnd);
	/* Compile the expression*/
	rc = jx9CompileExpr(&(*pGen), iFlags, xValidator);
	/* Restore token stream */
	RE_SWAP_DELIMITER(pGen);
	return rc;
}